

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenavitHartenberg.cpp
# Opt level: O1

bool iDynTree::transformFromAxes
               (Axis *xAxis,Axis *yAxis,Axis *zAxis,Transform *refFrame_H_frame,double tol)

{
  bool bVar1;
  char cVar2;
  PointerType ptr;
  double *pdVar3;
  double *pdVar4;
  undefined8 *puVar5;
  char *pcVar6;
  Position yzIntersectionOnZ;
  Position yzIntersectionOnY;
  Position xyIntersectionOnX;
  Direction zDirectionCheck;
  Position xyIntersectionOnY;
  Rotation rot;
  double local_1d8;
  double dStack_1d0;
  double local_1c8;
  double local_1b8;
  double dStack_1b0;
  double local_1a8;
  double local_198;
  double dStack_190;
  double local_188;
  Direction local_178;
  double local_158;
  double dStack_150;
  double local_148;
  Axis local_138;
  Axis local_108;
  Axis local_d8;
  Axis local_a8;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  iDynTree::Position::Position((Position *)&local_198);
  iDynTree::Position::Position((Position *)&local_158);
  iDynTree::Position::Position((Position *)&local_1b8);
  iDynTree::Position::Position((Position *)&local_1d8);
  iDynTree::Axis::Axis(&local_a8,xAxis);
  iDynTree::Axis::Axis(&local_d8,yAxis);
  bVar1 = closestPoints(&local_a8,&local_d8,(Position *)&local_198,(Position *)&local_158,tol);
  if (bVar1) {
    iDynTree::Axis::Axis(&local_108,yAxis);
    iDynTree::Axis::Axis(&local_138,zAxis);
    bVar1 = closestPoints(&local_108,&local_138,(Position *)&local_1b8,(Position *)&local_1d8,tol);
    if (bVar1) {
      if ((tol < SQRT((local_188 - local_148) * (local_188 - local_148) +
                      (dStack_190 - dStack_150) * (dStack_190 - dStack_150) +
                      (local_198 - local_158) * (local_198 - local_158))) ||
         (tol < SQRT((local_1a8 - local_1c8) * (local_1a8 - local_1c8) +
                     (dStack_1b0 - dStack_1d0) * (dStack_1b0 - dStack_1d0) +
                     (local_1b8 - local_1d8) * (local_1b8 - local_1d8)))) {
        pcVar6 = "x and y are not incident";
      }
      else if (SQRT((local_188 - local_1a8) * (local_188 - local_1a8) +
                    (dStack_190 - dStack_1b0) * (dStack_190 - dStack_1b0) +
                    (local_198 - local_1b8) * (local_198 - local_1b8)) <= tol) {
        pdVar3 = (double *)iDynTree::Axis::getDirection();
        pdVar4 = (double *)iDynTree::Axis::getDirection();
        local_178.super_Vector3.m_data[0] = pdVar4[2] * pdVar3[1] - pdVar3[2] * pdVar4[1];
        local_178.super_Vector3.m_data[1] = *pdVar4 * pdVar3[2] - *pdVar3 * pdVar4[2];
        local_178.super_Vector3.m_data[2] = *pdVar3 * pdVar4[1] - *pdVar4 * pdVar3[1];
        iDynTree::Axis::getDirection();
        cVar2 = iDynTree::Direction::isParallel(&local_178,tol);
        if (cVar2 == '\0') {
          pcVar6 = "x cross y is not parallel to z";
        }
        else {
          pdVar3 = (double *)iDynTree::Axis::getDirection();
          if (0.0 <= pdVar3[2] * local_178.super_Vector3.m_data[2] +
                     pdVar3[1] * local_178.super_Vector3.m_data[1] +
                     *pdVar3 * local_178.super_Vector3.m_data[0]) {
            iDynTree::Transform::setPosition((Position *)refFrame_H_frame);
            iDynTree::Rotation::Rotation((Rotation *)&local_78);
            puVar5 = (undefined8 *)iDynTree::Axis::getDirection();
            local_78 = *puVar5;
            local_60 = puVar5[1];
            local_48 = puVar5[2];
            puVar5 = (undefined8 *)iDynTree::Axis::getDirection();
            local_70 = *puVar5;
            local_58 = puVar5[1];
            local_40 = puVar5[2];
            puVar5 = (undefined8 *)iDynTree::Axis::getDirection();
            local_68 = *puVar5;
            local_50 = puVar5[1];
            local_38 = puVar5[2];
            iDynTree::Transform::setRotation((Rotation *)refFrame_H_frame);
            return true;
          }
          pcVar6 = "x cross y is not in the same direction of z";
        }
      }
      else {
        pcVar6 = "xy intersection is not coincident with yz intersection";
      }
    }
    else {
      pcVar6 = "yAxis is parallel with the zAxis";
    }
  }
  else {
    pcVar6 = "xAxis is parallel with the yAxis";
  }
  iDynTree::reportError("","transformFromAxes",pcVar6);
  return false;
}

Assistant:

bool transformFromAxes(const Axis xAxis,
                       const Axis yAxis,
                       const Axis zAxis,
                             Transform& refFrame_H_frame,
                             double tol=1e-5)
{
    // Check axis are consistent (they share the origin)
    Position xyIntersectionOnX, xyIntersectionOnY, yzIntersectionOnY, yzIntersectionOnZ;
    bool ok = closestPoints(xAxis, yAxis, xyIntersectionOnX, xyIntersectionOnY, tol);
    if (!ok)
    {
        reportError("","transformFromAxes","xAxis is parallel with the yAxis");
        return false;
    }

    ok = closestPoints(yAxis, zAxis, yzIntersectionOnY, yzIntersectionOnZ, tol);
    if (!ok)
    {
        reportError("","transformFromAxes","yAxis is parallel with the zAxis");
        return false;
    }

    if ((toEigen(xyIntersectionOnX)-toEigen(xyIntersectionOnY)).norm() > tol)
    {
        reportError("","transformFromAxes","x and y are not incident");
        return false;
    }

    if ((toEigen(yzIntersectionOnY)-toEigen(yzIntersectionOnZ)).norm() > tol)
    {
        reportError("","transformFromAxes","x and y are not incident");
        return false;
    }

    if ((toEigen(xyIntersectionOnX)-toEigen(yzIntersectionOnY)).norm() > tol)
    {
        reportError("","transformFromAxes","xy intersection is not coincident with yz intersection");
        return false;
    }

    iDynTree::Direction zDirectionCheck;
    toEigen(zDirectionCheck) = toEigen(xAxis.getDirection()).cross(toEigen(yAxis.getDirection()));
    if (!zDirectionCheck.isParallel(zAxis.getDirection(),tol))
    {
        reportError("","transformFromAxes","x cross y is not parallel to z");
        return false;
    }

    if ((toEigen(zDirectionCheck).dot(toEigen(zAxis.getDirection()))) < 0.0)
    {
        reportError("","transformFromAxes","x cross y is not in the same direction of z");
        return false;
    }

    refFrame_H_frame.setPosition(xyIntersectionOnX);
    iDynTree::Rotation rot;
    toEigen(rot).block<3,1>(0,0) = toEigen(xAxis.getDirection());
    toEigen(rot).block<3,1>(0,1) = toEigen(yAxis.getDirection());
    toEigen(rot).block<3,1>(0,2) = toEigen(zAxis.getDirection());
    refFrame_H_frame.setRotation(rot);

    return true;
}